

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

MD5 * __thiscall MD5::finalize(MD5 *this)

{
  uint uVar1;
  uchar bits [8];
  
  if (this->finalized == false) {
    encode(bits,this->count,8);
    uVar1 = this->count[0] >> 3 & 0x3f;
    update(this,finalize::padding,((uint)(0x37 < uVar1) << 6 | 0x38) - uVar1);
    update(this,bits,8);
    encode(this->digest,this->state,0x10);
    this->buffer[0x30] = '\0';
    this->buffer[0x31] = '\0';
    this->buffer[0x32] = '\0';
    this->buffer[0x33] = '\0';
    this->buffer[0x34] = '\0';
    this->buffer[0x35] = '\0';
    this->buffer[0x36] = '\0';
    this->buffer[0x37] = '\0';
    this->buffer[0x38] = '\0';
    this->buffer[0x39] = '\0';
    this->buffer[0x3a] = '\0';
    this->buffer[0x3b] = '\0';
    this->buffer[0x3c] = '\0';
    this->buffer[0x3d] = '\0';
    this->buffer[0x3e] = '\0';
    this->buffer[0x3f] = '\0';
    this->buffer[0x20] = '\0';
    this->buffer[0x21] = '\0';
    this->buffer[0x22] = '\0';
    this->buffer[0x23] = '\0';
    this->buffer[0x24] = '\0';
    this->buffer[0x25] = '\0';
    this->buffer[0x26] = '\0';
    this->buffer[0x27] = '\0';
    this->buffer[0x28] = '\0';
    this->buffer[0x29] = '\0';
    this->buffer[0x2a] = '\0';
    this->buffer[0x2b] = '\0';
    this->buffer[0x2c] = '\0';
    this->buffer[0x2d] = '\0';
    this->buffer[0x2e] = '\0';
    this->buffer[0x2f] = '\0';
    this->buffer[0x10] = '\0';
    this->buffer[0x11] = '\0';
    this->buffer[0x12] = '\0';
    this->buffer[0x13] = '\0';
    this->buffer[0x14] = '\0';
    this->buffer[0x15] = '\0';
    this->buffer[0x16] = '\0';
    this->buffer[0x17] = '\0';
    this->buffer[0x18] = '\0';
    this->buffer[0x19] = '\0';
    this->buffer[0x1a] = '\0';
    this->buffer[0x1b] = '\0';
    this->buffer[0x1c] = '\0';
    this->buffer[0x1d] = '\0';
    this->buffer[0x1e] = '\0';
    this->buffer[0x1f] = '\0';
    this->buffer[0] = '\0';
    this->buffer[1] = '\0';
    this->buffer[2] = '\0';
    this->buffer[3] = '\0';
    this->buffer[4] = '\0';
    this->buffer[5] = '\0';
    this->buffer[6] = '\0';
    this->buffer[7] = '\0';
    this->buffer[8] = '\0';
    this->buffer[9] = '\0';
    this->buffer[10] = '\0';
    this->buffer[0xb] = '\0';
    this->buffer[0xc] = '\0';
    this->buffer[0xd] = '\0';
    this->buffer[0xe] = '\0';
    this->buffer[0xf] = '\0';
    this->count[0] = 0;
    this->count[1] = 0;
    this->finalized = true;
  }
  return this;
}

Assistant:

MD5& MD5::finalize()
{
  static unsigned char padding[64] = {
    0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
  };
 
  if (!finalized) {
    // Save number of bits
    unsigned char bits[8];
    encode(bits, count, 8);
 
    // pad out to 56 mod 64.
    size_type index = count[0] / 8 % 64;
    size_type padLen = (index < 56) ? (56 - index) : (120 - index);
    update(padding, padLen);
 
    // Append length (before padding)
    update(bits, 8);
 
    // Store state in digest
    encode(digest, state, 16);
 
    // Zeroize sensitive information.
    memset(buffer, 0, sizeof buffer);
    memset(count, 0, sizeof count);
 
    finalized=true;
  }
 
  return *this;
}